

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_free(REF_NODE ref_node)

{
  REF_NODE ref_node_local;
  
  if (ref_node == (REF_NODE)0x0) {
    ref_node_local._4_4_ = 2;
  }
  else {
    if (ref_node->unused_global != (REF_GLOB *)0x0) {
      free(ref_node->unused_global);
    }
    if (ref_node->aux != (REF_DBL *)0x0) {
      free(ref_node->aux);
    }
    if (ref_node->real != (REF_DBL *)0x0) {
      free(ref_node->real);
    }
    if (ref_node->age != (REF_INT *)0x0) {
      free(ref_node->age);
    }
    if (ref_node->part != (REF_INT *)0x0) {
      free(ref_node->part);
    }
    if (ref_node->sorted_local != (REF_INT *)0x0) {
      free(ref_node->sorted_local);
    }
    if (ref_node->sorted_global != (REF_GLOB *)0x0) {
      free(ref_node->sorted_global);
    }
    if (ref_node->global != (REF_GLOB *)0x0) {
      free(ref_node->global);
    }
    if (ref_node != (REF_NODE)0x0) {
      free(ref_node);
    }
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_free(REF_NODE ref_node) {
  if (NULL == (void *)ref_node) return REF_NULL;
  ref_free(ref_node->unused_global);
  /* ref_mpi reference only */
  ref_free(ref_node->aux);
  ref_free(ref_node->real);
  ref_free(ref_node->age);
  ref_free(ref_node->part);
  ref_free(ref_node->sorted_local);
  ref_free(ref_node->sorted_global);
  ref_free(ref_node->global);
  ref_free(ref_node);
  return REF_SUCCESS;
}